

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
CAssignStm::CAssignStm(CAssignStm *this,CIdExp *leftExpression,IExpression *rightExpression)

{
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_50;
  unique_ptr<CIdExp,_std::default_delete<CIdExp>_> local_48 [3];
  PositionInfo local_30;
  IExpression *local_20;
  IExpression *rightExpression_local;
  CIdExp *leftExpression_local;
  CAssignStm *this_local;
  
  local_20 = rightExpression;
  rightExpression_local = &leftExpression->super_IExpression;
  leftExpression_local = (CIdExp *)this;
  IStatement::IStatement((IStatement *)this);
  (this->super_IStatement).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00237278;
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)&this->leftExpression);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->rightExpression);
  local_30 = PositionInfo::operator+
                       (&(rightExpression_local->super_PositionedNode).position,
                        &(local_20->super_PositionedNode).position);
  (this->super_IStatement).super_PositionedNode.position = local_30;
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)local_48,
             (pointer)rightExpression_local);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator=(&this->leftExpression,local_48);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::~unique_ptr(local_48);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_50,local_20);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->rightExpression,&local_50);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_50);
  return;
}

Assistant:

CAssignStm::CAssignStm(
	CIdExp* leftExpression,
	IExpression* rightExpression
) {
	this->position = leftExpression->position + rightExpression->position;
	this->leftExpression = std::unique_ptr<CIdExp>(leftExpression);
	this->rightExpression = std::unique_ptr<IExpression>(rightExpression);
}